

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu2.c
# Opt level: O2

MPP_RET vdpu2_h264d_control(void *hal,MpiCmd cmd_type,void *param)

{
  H264dHalCtx_t *p_hal;
  undefined8 in_R9;
  
  if ((hal == (void *)0x0) && (((byte)hal_h264d_debug & 4) != 0)) {
    _mpp_log_l(4,"hal_h264d_vdpu_reg","input empty(%d).\n",(char *)0x0,0x457,in_R9,&hal_h264d_debug)
    ;
  }
  return MPP_OK;
}

Assistant:

MPP_RET vdpu2_h264d_control(void *hal, MpiCmd cmd_type, void *param)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dHalCtx_t *p_hal = (H264dHalCtx_t *)hal;

    INP_CHECK(ret, NULL == p_hal);

    (void)hal;
    (void)cmd_type;
    (void)param;
__RETURN:
    return ret = MPP_OK;
}